

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# FreeCamera.cpp
# Opt level: O3

vec3 __thiscall fw::FreeCamera::getWorldRightDirection(FreeCamera *this)

{
  undefined8 uVar1;
  undefined8 uVar2;
  float fVar3;
  float fVar4;
  float fVar5;
  float fVar6;
  vec3 vVar7;
  
  vVar7 = getWorldForwardDirection(this);
  uVar1 = *(undefined8 *)&(this->_upDirection).field_0;
  uVar2 = *(undefined8 *)((long)&(this->_upDirection).field_0 + 4);
  fVar3 = (float)uVar1;
  fVar6 = vVar7.field_0._8_4_ * fVar3 - (this->_upDirection).field_0.field_0.z * vVar7.field_0._0_4_
  ;
  fVar4 = (float)uVar2 * vVar7.field_0._0_4_ - vVar7.field_0._4_4_ * fVar3;
  fVar5 = (float)((ulong)uVar2 >> 0x20) * vVar7.field_0._4_4_ -
          vVar7.field_0._8_4_ * (float)((ulong)uVar1 >> 0x20);
  fVar3 = 1.0 / SQRT(fVar5 * fVar5 + fVar6 * fVar6 + fVar4 * fVar4);
  vVar7.field_0._0_4_ = fVar5 * fVar3;
  vVar7.field_0.field_0.y = fVar6 * fVar3;
  vVar7.field_0._8_4_ = fVar3 * fVar4;
  return (vec3)vVar7.field_0;
}

Assistant:

glm::vec3 FreeCamera::getWorldRightDirection() const
{
    return glm::normalize(
        glm::cross(getWorldForwardDirection(), getWorldUpDirection())
    );
}